

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void __thiscall
glslang::TReflectionTraverser::addPipeIOVariable(TReflectionTraverser *this,TIntermSymbol *base)

{
  _Rb_tree_header *p_Var1;
  EShLanguageMask *pEVar2;
  uint uVar3;
  TReflection *pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  _Base_ptr p_Var11;
  undefined4 extraout_var;
  TType *type;
  undefined4 extraout_var_01;
  iterator iVar12;
  undefined4 extraout_var_02;
  mapped_type *pmVar13;
  undefined4 extraout_var_03;
  _Base_ptr in_RCX;
  size_type sVar14;
  void *__child_stack;
  long lVar15;
  pointer pcVar16;
  TPoolAllocator *__fn;
  void *in_R8;
  bool input;
  long lVar17;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *this_01;
  TString baseName;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_f8;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  int local_a0;
  int local_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  char *local_88;
  TType *local_80;
  undefined4 extraout_var_00;
  
  p_Var11 = (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var11 != (_Base_ptr)0x0) {
    p_Var1 = &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header;
    in_RCX = &p_Var1->_M_header;
    do {
      if (*(TIntermSymbol **)(p_Var11 + 1) >= base) {
        in_RCX = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(TIntermSymbol **)(p_Var11 + 1) < base];
    } while (p_Var11 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)in_RCX != p_Var1) && (*(TIntermSymbol **)(in_RCX + 1) <= base)) {
      return;
    }
  }
  iVar8 = (int)in_RCX;
  local_c8._0_8_ = base;
  std::
  _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
  ::_M_insert_unique<TIntermNode_const*>
            ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
              *)&this->processedDerefs,(TIntermNode **)local_c8);
  iVar7 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(base);
  local_f8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             CONCAT44(extraout_var,iVar7);
  iVar7 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
  type = (TType *)CONCAT44(extraout_var_00,iVar7);
  iVar7 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(base);
  uVar3 = *(uint *)(CONCAT44(extraout_var_01,iVar7) + 8);
  lVar17 = 200;
  lVar15 = 0x170;
  input = false;
  if (((uVar3 & 0x7f) < 0x1c) &&
     (iVar8 = 0xe300008, input = false, (0xe300008U >> (uVar3 & 0x1f) & 1) != 0)) {
    input = true;
    lVar17 = 0x98;
    lVar15 = 0x158;
  }
  pTVar4 = this->reflection;
  if ((pTVar4->options & EShReflectionUnwrapIOBlocks) == EShReflectionDefault) {
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)((long)&pTVar4->_vptr_TReflection + lVar17);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(local_f8->_M_dataplus)._M_p,(allocator<char> *)local_f0);
    iVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(this_00,(key_type *)local_c8);
    if ((TIntermSymbol *)local_c8._0_8_ != (TIntermSymbol *)local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    this_01 = (vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *)
              ((long)&pTVar4->_vptr_TReflection + lVar15);
    if ((_Rb_tree_header *)iVar12._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
      pEVar2 = &(this_01->
                super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                )._M_impl.super__Vector_impl_data._M_start[(int)iVar12._M_node[2]._M_color].stages;
      *pEVar2 = *pEVar2 | 1 << ((char)this->intermediate->language & 0x1f);
      return;
    }
    pTVar5 = (this_01->
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pTVar6 = (this_01->
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(local_f8->_M_dataplus)._M_p,(allocator<char> *)local_f0);
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)this_00,(key_type *)local_c8);
    *pmVar13 = (int)((ulong)((long)pTVar5 - (long)pTVar6) >> 4) * -0x33333333;
    if ((TIntermSymbol *)local_c8._0_8_ != (TIntermSymbol *)local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,(local_f8->_M_dataplus)._M_p,&local_f9);
    iVar7 = mapToGlType(this,type);
    iVar9 = (*type->_vptr_TType[0x1d])(type);
    iVar10 = 1;
    if ((char)iVar9 != '\0') {
      iVar10 = (*type->_vptr_TType[0xf])(type);
    }
    __fn = (TPoolAllocator *)local_f0._0_8_;
    local_c8._0_8_ = (TIntermSymbol *)local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_f0._0_8_,(pointer)(local_f0._8_8_ + local_f0._0_8_));
    local_b8._16_4_ = 0;
    local_9c = 0;
    iStack_98 = -1;
    iStack_94 = -1;
    iStack_90 = 0;
    local_88 = (char *)0x0;
    local_b8._20_4_ = iVar7;
    local_a0 = iVar10;
    iVar7 = TType::clone(type,(__fn *)__fn,__child_stack,iVar8,in_R8);
    local_80 = (TType *)CONCAT44(extraout_var_03,iVar7);
    std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
    emplace_back<glslang::TObjectReflection>(this_01,(TObjectReflection *)local_c8);
    if ((TIntermSymbol *)local_c8._0_8_ != (TIntermSymbol *)local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    if ((TPoolAllocator *)local_f0._0_8_ != (TPoolAllocator *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    pEVar2 = &(this_01->
              super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
              )._M_impl.super__Vector_impl_data._M_finish[-1].stages;
    *pEVar2 = *pEVar2 | 1 << ((char)this->intermediate->language & 0x1f);
    return;
  }
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(local_f8,0,5,"anon@");
  local_f0._0_8_ = GetThreadPoolAllocator();
  local_f0._16_8_ = 0;
  local_d8._M_local_buf[0] = '\0';
  local_f0._8_8_ = &local_d8;
  iVar8 = (*type->_vptr_TType[7])(type);
  if (iVar8 == 0x10) {
    if (iVar7 == 0) {
      local_c8._0_8_ = GetThreadPoolAllocator();
      local_b8._0_8_ = 0;
      local_b8[8] = '\0';
      local_c8._8_8_ = local_b8 + 8;
      goto LAB_003fbfed;
    }
    iVar7 = (*type->_vptr_TType[5])(type);
    local_c8._0_8_ = GetThreadPoolAllocator();
    pcVar16 = *(pointer *)(CONCAT44(extraout_var_02,iVar7) + 8);
    sVar14 = *(size_type *)(CONCAT44(extraout_var_02,iVar7) + 0x10);
  }
  else {
    local_c8._0_8_ = GetThreadPoolAllocator();
    local_c8._8_8_ = local_b8 + 8;
    if (iVar7 == 0) {
      local_b8._0_8_ = 0;
      local_b8[8] = '\0';
      goto LAB_003fbfed;
    }
    pcVar16 = (local_f8->_M_dataplus)._M_p;
    sVar14 = local_f8->_M_string_length;
  }
  local_c8._8_8_ = local_b8 + 8;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      local_c8,pcVar16,pcVar16 + sVar14);
LAB_003fbfed:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_f0,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_c8);
  iVar7 = (*type->_vptr_TType[0x1d])(type);
  if (((char)iVar7 != '\0') && (iVar7 = (*type->_vptr_TType[7])(type), iVar7 == 0x10)) {
    TType::TType((TType *)local_c8,type,0,false);
    type = (TType *)local_c8;
  }
  blowUpIOAggregate(this,input,(TString *)local_f0,type);
  return;
}

Assistant:

void addPipeIOVariable(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            const TString &name = base.getName();
            const TType &type = base.getType();
            const bool input = base.getQualifier().isPipeInput();

            TReflection::TMapIndexToReflection &ioItems =
                input ? reflection.indexToPipeInput : reflection.indexToPipeOutput;


            TReflection::TNameToIndex &ioMapper =
                input ? reflection.pipeInNameToIndex : reflection.pipeOutNameToIndex;

            if (reflection.options & EShReflectionUnwrapIOBlocks) {
                bool anonymous = IsAnonymous(name);

                TString baseName;
                if (type.getBasicType() == EbtBlock) {
                    baseName = anonymous ? TString() : type.getTypeName();
                } else {
                    baseName = anonymous ? TString() : name;
                }

                // by convention if this is an arrayed block we ignore the array in the reflection
                if (type.isArray() && type.getBasicType() == EbtBlock) {
                    blowUpIOAggregate(input, baseName, TType(type, 0));
                } else {               
                    blowUpIOAggregate(input, baseName, type);
                }
            } else {
                TReflection::TNameToIndex::const_iterator it = ioMapper.find(name.c_str());
                if (it == ioMapper.end()) {
                    // seperate pipe i/o params from uniforms and blocks
                    // in is only for input in first stage as out is only for last stage. check traverse in call stack.
                    ioMapper[name.c_str()] = static_cast<int>(ioItems.size());
                    ioItems.push_back(
                        TObjectReflection(name.c_str(), type, 0, mapToGlType(type), mapToGlArraySize(type), 0));
                    EShLanguageMask& stages = ioItems.back().stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                } else {
                    EShLanguageMask& stages = ioItems[it->second].stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                }
            }
        }
    }